

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

void Vec_WecErase(Vec_Wec_t *p)

{
  Vec_Int_t *__ptr;
  void *__ptr_00;
  long lVar1;
  int i;
  long lVar2;
  
  lVar1 = 8;
  for (lVar2 = 0; __ptr = p->pArray, lVar2 < p->nCap; lVar2 = lVar2 + 1) {
    __ptr_00 = *(void **)((long)&__ptr->nCap + lVar1);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
      *(undefined8 *)((long)&p->pArray->nCap + lVar1) = 0;
    }
    lVar1 = lVar1 + 0x10;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
    p->pArray = (Vec_Int_t *)0x0;
  }
  p->nCap = 0;
  p->nSize = 0;
  return;
}

Assistant:

static inline void Vec_WecErase( Vec_Wec_t * p )
{
    int i;
    for ( i = 0; i < p->nCap; i++ )
        ABC_FREE( p->pArray[i].pArray );
    ABC_FREE( p->pArray );
    p->nSize = 0;
    p->nCap = 0;
}